

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfGenericInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_2::GenericInputFile::readMagicNumberAndVersionField
          (GenericInputFile *this,IStream *is,int *version)

{
  uint uVar1;
  ostream *poVar2;
  InputExc *pIVar3;
  char b [4];
  uint local_1a8 [4];
  ostream local_198 [376];
  
  (*is->_vptr_IStream[3])(is,local_1a8,4);
  uVar1 = local_1a8[0];
  (*is->_vptr_IStream[3])(is,local_1a8,4);
  *version = local_1a8[0];
  if (uVar1 != 0x1312f76) {
    pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(pIVar3,"File is not an image file.");
    __cxa_throw(pIVar3,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  if ((char)local_1a8[0] == '\x02') {
    if ((local_1a8[0] & 0xffffe100) == 0) {
      return;
    }
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_198,"The file format version number\'s flag field contains unrecognized flags."
               ,0x48);
    pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(pIVar3,(stringstream *)local_1a8);
    __cxa_throw(pIVar3,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Cannot read version ",0x14);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_198,(uint)(byte)*version);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2," image files.  Current file format version is ",0x2e);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::InputExc::InputExc(pIVar3,(stringstream *)local_1a8);
  __cxa_throw(pIVar3,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
}

Assistant:

void
GenericInputFile::readMagicNumberAndVersionField (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int& version)
{
    //
    // Read the magic number and the file format version number.
    // Then check if we can read the rest of this file.
    //

    int magic;

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, magic);
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, version);

    if (magic != MAGIC)
    {
        throw IEX_NAMESPACE::InputExc ("File is not an image file.");
    }

    if (getVersion (version) != EXR_VERSION)
    {
        THROW (
            IEX_NAMESPACE::InputExc,
            "Cannot read "
            "version "
                << getVersion (version)
                << " "
                   "image files.  Current file format version "
                   "is "
                << EXR_VERSION << ".");
    }

    if (!supportsFlags (getFlags (version)))
    {
        THROW (
            IEX_NAMESPACE::InputExc,
            "The file format version number's flag field "
            "contains unrecognized flags.");
    }
}